

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::MockEndpoint::Send
          (Error *__return_storage_ptr__,MockEndpoint *this,ByteArray *aBuf,MessageSubType aSubType)

{
  MessageSubType aSubType_local;
  ByteArray *aBuf_local;
  MockEndpoint *this_local;
  
  if ((this->mDropMessage & 1U) == 0) {
    std::
    queue<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::deque<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
    ::emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
              ((queue<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::deque<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                *)&this->mSendQueue,aBuf);
    event_active(&this->mPeer->mSendEvent,0,0);
  }
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error Send(const ByteArray &aBuf, MessageSubType aSubType) override
    {
        (void)aSubType;

        if (!mDropMessage)
        {
            mSendQueue.emplace(aBuf);
            event_active(&mPeer->mSendEvent, 0, 0);
        }
        return ERROR_NONE;
    }